

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::PrintToString(Printer *this,Message *message,string *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  StringOutputStream output_stream;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x5e4);
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: output: ");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"output specified is NULL");
    internal::LogFinisher::operator=(&local_59,pLVar2);
    internal::LogMessage::~LogMessage(&local_58);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_58,output);
  bVar1 = Print(this,message,(ZeroCopyOutputStream *)&local_58);
  io::StringOutputStream::~StringOutputStream((StringOutputStream *)&local_58);
  return bVar1;
}

Assistant:

bool TextFormat::Printer::PrintToString(const Message& message,
                                        string* output) const {
  GOOGLE_DCHECK(output) << "output specified is NULL";

  output->clear();
  io::StringOutputStream output_stream(output);

  return Print(message, &output_stream);
}